

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O2

void laplacian(qnode_ptr_t p)

{
  image512_t *pafVar1;
  int iVar2;
  qnode_ptr_t p_00;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  kernel_t *pkVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  byte bVar12;
  undefined8 auStack_828 [258];
  
  bVar12 = 0;
  p_00 = create_node(0,p->res,p->sizx,p->sizy);
  alloc_lap(p_00);
  pafVar1 = p->lap_ptr;
  p_00->gauss_ptr = pafVar1;
  uVar3 = p_00->sizy;
  if (p_00->sizy < 1) {
    uVar3 = 0;
  }
  for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    uVar6 = p_00->sizx;
    if (p_00->sizx < 1) {
      uVar6 = 0;
    }
    for (lVar10 = 0; uVar6 != (uint)lVar10; lVar10 = lVar10 + 1) {
      if ((uVar4 & 1 & (uint)lVar10) == 0) {
        (*pafVar1)[(long)p_00->res * (long)(int)uVar4 + lVar10] = 0.0;
      }
    }
  }
  pkVar8 = &kerb;
  puVar9 = auStack_828;
  for (lVar10 = 0x101; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar9 = *(undefined8 *)pkVar8->k;
    pkVar8 = (kernel_t *)((long)pkVar8 + ((ulong)bVar12 * -2 + 1) * 8);
    puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
  }
  convolve(p_00);
  p->lap_ptr = p_00->lap_ptr;
  dealloc_gauss(p_00);
  free(p_00);
  iVar2 = p->sizy;
  if (p->sizy < 1) {
    iVar2 = 0;
  }
  for (iVar5 = 0; iVar5 != iVar2; iVar5 = iVar5 + 1) {
    iVar7 = p->sizx;
    if (p->sizx < 1) {
      iVar7 = 0;
    }
    for (lVar10 = 0; iVar7 != (int)lVar10; lVar10 = lVar10 + 1) {
      lVar11 = (long)p->res * (long)iVar5 + lVar10;
      (*p->lap_ptr)[lVar11] = (*p->gauss_ptr)[lVar11] - (*p->lap_ptr)[lVar11];
    }
  }
  return;
}

Assistant:

void laplacian(p)
qnode_ptr_t p ;

{ extern kernel_t kerb ;
  qnode_ptr_t create_node(), q ;
  int i, j ;

  q = create_node(0,p->res,p->sizx,p->sizy) ;
  alloc_lap(q) ;
  q->gauss_ptr = p->lap_ptr ;
  for (i = 0 ; i < q->sizy ; i++) {
    for (j = 0 ; j < q->sizx ; j++) {
      if ((i%2 == 0) || (j%2 == 0)) {
        (*q->gauss_ptr)[q->res*i + j] = 0.0 ;
      }
    }
  }
  convolve(q,kerb) ;
  p->lap_ptr = q->lap_ptr ;
  dealloc_gauss(q) ;
  free(q) ;
  for (i = 0 ; i < p->sizy ; i++) {
    for (j = 0 ; j < p->sizx ; j++) {
      (*p->lap_ptr)[p->res*i + j] =
      (*p->gauss_ptr)[p->res*i + j] - (*p->lap_ptr)[p->res*i + j] ;
    }
  }
}